

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlreader.c
# Opt level: O0

xmlNodePtr xmlTextReaderGetSuccessor(xmlNodePtr cur)

{
  xmlNodePtr local_18;
  xmlNodePtr cur_local;
  
  if (cur == (xmlNodePtr)0x0) {
    cur_local = (xmlNodePtr)0x0;
  }
  else {
    local_18 = cur;
    if (cur->next == (_xmlNode *)0x0) {
      do {
        local_18 = local_18->parent;
        if (local_18 == (_xmlNode *)0x0) {
          return (xmlNodePtr)0x0;
        }
        if (local_18->next != (_xmlNode *)0x0) {
          return local_18->next;
        }
        cur_local = local_18;
      } while (local_18 != (_xmlNode *)0x0);
    }
    else {
      cur_local = cur->next;
    }
  }
  return cur_local;
}

Assistant:

static xmlNodePtr
xmlTextReaderGetSuccessor(xmlNodePtr cur) {
    if (cur == NULL) return(NULL) ; /* ERROR */
    if (cur->next != NULL) return(cur->next) ;
    do {
        cur = cur->parent;
        if (cur == NULL) break;
        if (cur->next != NULL) return(cur->next);
    } while (cur != NULL);
    return(cur);
}